

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

GreaterEqualLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_greaterequal(NeuralNetworkLayer *this)

{
  LayerUnion this_00;
  
  if (this->_oneof_case_[0] == 0x340) {
    this_00 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x340;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x18);
    GreaterEqualLayerParams::GreaterEqualLayerParams(this_00.greaterequal_);
    (this->layer_).greaterequal_ = (GreaterEqualLayerParams *)this_00;
  }
  return (GreaterEqualLayerParams *)this_00.convolution_;
}

Assistant:

inline ::CoreML::Specification::GreaterEqualLayerParams* NeuralNetworkLayer::mutable_greaterequal() {
  if (!has_greaterequal()) {
    clear_layer();
    set_has_greaterequal();
    layer_.greaterequal_ = new ::CoreML::Specification::GreaterEqualLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.greaterEqual)
  return layer_.greaterequal_;
}